

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O1

void anon_unknown.dwarf_c460d::replaceInPlace(Ref target,Ref value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Value *local_38;
  Ref target_local;
  Ref value_local;
  
  local_38 = target.inst;
  target_local = value;
  if (((target.inst)->type == Array) && ((value.inst)->type == Array)) {
    cashew::Value::setSize
              (target.inst,
               ((((value.inst)->field_1).arr)->
               super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements);
    if ((target_local.inst)->type == Array) {
      uVar3 = 0;
      do {
        if (((((target_local.inst)->field_1).arr)->
            super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar3) {
          return;
        }
        puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&target_local);
        puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
        *puVar2 = *puVar1;
        uVar3 = uVar3 + 1;
      } while ((target_local.inst)->type == Array);
    }
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x19a,"size_t cashew::Value::size()");
  }
  __assert_fail("target->isArray() && value->isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm2js.cpp"
                ,0x85,"void (anonymous namespace)::replaceInPlace(Ref, Ref)");
}

Assistant:

static void replaceInPlace(Ref target, Ref value) {
  assert(target->isArray() && value->isArray());
  target->setSize(value->size());
  for (size_t i = 0; i < value->size(); i++) {
    target[i] = value[i];
  }
}